

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::AddSubDirectory
          (cmMakefile *this,string *srcPath,string *binPath,bool excludeFromAll,bool immediate)

{
  cmMakefile *this_00;
  Snapshot snapshot;
  bool bVar1;
  cmLocalGenerator *lg;
  cmMakefile *subMf;
  Snapshot newSnapshot;
  allocator local_71;
  cmMakefile *local_70;
  string local_68;
  Snapshot local_48;
  
  bVar1 = EnforceUniqueDir(this,srcPath,binPath);
  if (bVar1) {
    cmState::CreateBuildsystemDirectorySnapshot
              (&local_48,this->LocalGenerator->GlobalGenerator->CMakeInstance->State,
               this->StateSnapshot);
    snapshot.Position.Tree = local_48.Position.Tree;
    snapshot.State = local_48.State;
    snapshot.Position.Position = local_48.Position.Position;
    lg = cmGlobalGenerator::MakeLocalGenerator
                   (this->LocalGenerator->GlobalGenerator,snapshot,this->LocalGenerator);
    cmGlobalGenerator::AddLocalGenerator(this->LocalGenerator->GlobalGenerator,lg);
    this_00 = lg->Makefile;
    local_70 = this_00;
    SetCurrentSourceDirectory(this_00,srcPath);
    SetCurrentBinaryDirectory(this_00,binPath);
    if (excludeFromAll) {
      std::__cxx11::string::string((string *)&local_68,"EXCLUDE_FROM_ALL",&local_71);
      SetProperty(this_00,&local_68,"TRUE");
      std::__cxx11::string::~string((string *)&local_68);
    }
    if (immediate) {
      ConfigureSubDirectory(this,this_00);
    }
    else {
      std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::push_back
                (&this->UnConfiguredDirectories,&local_70);
    }
  }
  return;
}

Assistant:

void cmMakefile::AddSubDirectory(const std::string& srcPath,
                                 const std::string& binPath,
                                 bool excludeFromAll,
                                 bool immediate)
{
  // Make sure the binary directory is unique.
  if(!this->EnforceUniqueDir(srcPath, binPath))
    {
    return;
    }

  cmState::Snapshot newSnapshot = this->GetState()
      ->CreateBuildsystemDirectorySnapshot(this->StateSnapshot);

  // create a new local generator and set its parent
  cmLocalGenerator *lg2 = this->GetGlobalGenerator()
        ->MakeLocalGenerator(newSnapshot, this->LocalGenerator);
  this->GetGlobalGenerator()->AddLocalGenerator(lg2);

  cmMakefile* subMf = lg2->GetMakefile();

  // set the subdirs start dirs
  subMf->SetCurrentSourceDirectory(srcPath);
  subMf->SetCurrentBinaryDirectory(binPath);
  if(excludeFromAll)
    {
    subMf->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
    }

  if (immediate)
    {
    this->ConfigureSubDirectory(subMf);
    }
  else
    {
    this->UnConfiguredDirectories.push_back(subMf);
    }
}